

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_packsshb_mips(uint64_t fs,uint64_t ft)

{
  short sVar1;
  uint local_24;
  int16_t tmp_1;
  int16_t tmp;
  uint i;
  uint64_t fd;
  uint64_t ft_local;
  uint64_t fs_local;
  
  _tmp_1 = 0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    sVar1 = (short)(fs >> ((byte)(local_24 << 4) & 0x3f));
    if (sVar1 < -0x80) {
      sVar1 = -0x80;
    }
    else if (0x7f < sVar1) {
      sVar1 = 0x7f;
    }
    _tmp_1 = (long)(int)((int)sVar1 & 0xff) << ((byte)(local_24 << 3) & 0x3f) | _tmp_1;
  }
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    sVar1 = (short)(ft >> ((byte)(local_24 << 4) & 0x3f));
    if (sVar1 < -0x80) {
      sVar1 = -0x80;
    }
    else if (0x7f < sVar1) {
      sVar1 = 0x7f;
    }
    _tmp_1 = (long)(int)((int)sVar1 & 0xff) << ((char)(local_24 << 3) + 0x20U & 0x3f) | _tmp_1;
  }
  return _tmp_1;
}

Assistant:

uint64_t helper_packsshb(uint64_t fs, uint64_t ft)
{
    uint64_t fd = 0;
    unsigned int i;

    for (i = 0; i < 4; ++i) {
        int16_t tmp = fs >> (i * 16);
        tmp = SATSB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8);
    }
    for (i = 0; i < 4; ++i) {
        int16_t tmp = ft >> (i * 16);
        tmp = SATSB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8 + 32);
    }

    return fd;
}